

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void idct64_stage6_high48_sse2(__m128i *x,int32_t *cospi,__m128i __rounding,int8_t cos_bit)

{
  long in_RDI;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  __m128i _in1_7;
  __m128i _in0_7;
  __m128i _in1_6;
  __m128i _in0_6;
  __m128i _in1_5;
  __m128i _in0_5;
  __m128i _in1_4;
  __m128i _in0_4;
  __m128i _in1_3;
  __m128i _in0_3;
  __m128i _in1_2;
  __m128i _in0_2;
  __m128i _in1_1;
  __m128i _in0_1;
  __m128i _in1;
  __m128i _in0;
  int8_t in_stack_000003af;
  __m128i in_stack_000003b0;
  int32_t *in_stack_000003c8;
  __m128i *in_stack_000003d0;
  
  auVar2 = *(undefined1 (*) [16])(in_RDI + 0x100);
  auVar1 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x100),*(undefined1 (*) [16])(in_RDI + 0x130));
  *(undefined1 (*) [16])(in_RDI + 0x100) = auVar1;
  auVar2 = psubsw(auVar2,*(undefined1 (*) [16])(in_RDI + 0x130));
  *(undefined1 (*) [16])(in_RDI + 0x130) = auVar2;
  auVar2 = *(undefined1 (*) [16])(in_RDI + 0x110);
  auVar1 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x110),*(undefined1 (*) [16])(in_RDI + 0x120));
  *(undefined1 (*) [16])(in_RDI + 0x110) = auVar1;
  auVar2 = psubsw(auVar2,*(undefined1 (*) [16])(in_RDI + 0x120));
  *(undefined1 (*) [16])(in_RDI + 0x120) = auVar2;
  auVar2 = *(undefined1 (*) [16])(in_RDI + 0x140);
  auVar1 = psubsw(*(undefined1 (*) [16])(in_RDI + 0x170),*(undefined1 (*) [16])(in_RDI + 0x140));
  *(undefined1 (*) [16])(in_RDI + 0x140) = auVar1;
  auVar2 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x170),auVar2);
  *(undefined1 (*) [16])(in_RDI + 0x170) = auVar2;
  auVar2 = *(undefined1 (*) [16])(in_RDI + 0x150);
  auVar1 = psubsw(*(undefined1 (*) [16])(in_RDI + 0x160),*(undefined1 (*) [16])(in_RDI + 0x150));
  *(undefined1 (*) [16])(in_RDI + 0x150) = auVar1;
  auVar2 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x160),auVar2);
  *(undefined1 (*) [16])(in_RDI + 0x160) = auVar2;
  auVar2 = *(undefined1 (*) [16])(in_RDI + 0x180);
  auVar1 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x180),*(undefined1 (*) [16])(in_RDI + 0x1b0));
  *(undefined1 (*) [16])(in_RDI + 0x180) = auVar1;
  auVar2 = psubsw(auVar2,*(undefined1 (*) [16])(in_RDI + 0x1b0));
  *(undefined1 (*) [16])(in_RDI + 0x1b0) = auVar2;
  auVar2 = *(undefined1 (*) [16])(in_RDI + 400);
  auVar1 = paddsw(*(undefined1 (*) [16])(in_RDI + 400),*(undefined1 (*) [16])(in_RDI + 0x1a0));
  *(undefined1 (*) [16])(in_RDI + 400) = auVar1;
  auVar2 = psubsw(auVar2,*(undefined1 (*) [16])(in_RDI + 0x1a0));
  *(undefined1 (*) [16])(in_RDI + 0x1a0) = auVar2;
  auVar2 = *(undefined1 (*) [16])(in_RDI + 0x1c0);
  auVar1 = psubsw(*(undefined1 (*) [16])(in_RDI + 0x1f0),*(undefined1 (*) [16])(in_RDI + 0x1c0));
  *(undefined1 (*) [16])(in_RDI + 0x1c0) = auVar1;
  auVar2 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x1f0),auVar2);
  *(undefined1 (*) [16])(in_RDI + 0x1f0) = auVar2;
  auVar2 = *(undefined1 (*) [16])(in_RDI + 0x1d0);
  auVar1 = psubsw(*(undefined1 (*) [16])(in_RDI + 0x1e0),*(undefined1 (*) [16])(in_RDI + 0x1d0));
  *(undefined1 (*) [16])(in_RDI + 0x1d0) = auVar1;
  auVar2 = paddsw(*(undefined1 (*) [16])(in_RDI + 0x1e0),auVar2);
  *(undefined1 (*) [16])(in_RDI + 0x1e0) = auVar2;
  idct64_stage6_high32_sse2(in_stack_000003d0,in_stack_000003c8,in_stack_000003b0,in_stack_000003af)
  ;
  return;
}

Assistant:

static inline void idct64_stage6_high48_sse2(__m128i *x, const int32_t *cospi,
                                             const __m128i __rounding,
                                             int8_t cos_bit) {
  btf_16_adds_subs_sse2(x[16], x[19]);
  btf_16_adds_subs_sse2(x[17], x[18]);
  btf_16_subs_adds_sse2(x[23], x[20]);
  btf_16_subs_adds_sse2(x[22], x[21]);
  btf_16_adds_subs_sse2(x[24], x[27]);
  btf_16_adds_subs_sse2(x[25], x[26]);
  btf_16_subs_adds_sse2(x[31], x[28]);
  btf_16_subs_adds_sse2(x[30], x[29]);
  idct64_stage6_high32_sse2(x, cospi, __rounding, cos_bit);
}